

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

GLFWbool hasUsableInputMethodStyle(void)

{
  long lVar1;
  uint i;
  XIMStyles *styles;
  GLFWbool found;
  uint local_14;
  ushort *local_10;
  GLFWbool local_8;
  GLFWbool local_4;
  
  local_8 = 0;
  local_10 = (ushort *)0x0;
  lVar1 = XGetIMValues(_glfw.x11.im,"queryInputStyle",&local_10,0);
  if (lVar1 == 0) {
    for (local_14 = 0; local_14 < *local_10; local_14 = local_14 + 1) {
      if (*(long *)(*(long *)(local_10 + 4) + (ulong)local_14 * 8) == 0x408) {
        local_8 = 1;
        break;
      }
    }
    XFree(local_10);
    local_4 = local_8;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static GLFWbool hasUsableInputMethodStyle(void)
{
    GLFWbool found = GLFW_FALSE;
    XIMStyles* styles = NULL;

    if (XGetIMValues(_glfw.x11.im, XNQueryInputStyle, &styles, NULL) != NULL)
        return GLFW_FALSE;

    for (unsigned int i = 0;  i < styles->count_styles;  i++)
    {
        if (styles->supported_styles[i] == (XIMPreeditNothing | XIMStatusNothing))
        {
            found = GLFW_TRUE;
            break;
        }
    }

    XFree(styles);
    return found;
}